

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

bool __thiscall BigInt::operator!=(BigInt *this,BigInt *b)

{
  __type_conflict _Var1;
  string sStack_58;
  string local_38;
  
  to_string_abi_cxx11_(&sStack_58,this);
  to_string_abi_cxx11_(&local_38,b);
  _Var1 = std::operator==(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return !_Var1;
}

Assistant:

bool BigInt::operator!=(BigInt& b) {
    return !(this->to_string() == b.to_string());
}